

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O0

void __thiscall TcpProxy::handleConnectRequest(TcpProxy *this,Connection *conn)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint16_t uVar1;
  Buffer *this_01;
  off_t oVar2;
  char *pcVar3;
  Logger *pLVar4;
  char *pcVar5;
  element_type *peVar6;
  TimerId TVar7;
  size_t in_RCX;
  void *in_RDX;
  double __x;
  double __x_00;
  anon_class_40_3_155447e0 local_188;
  Connector local_160;
  enable_shared_from_this<Liby::Connection> local_140;
  undefined1 local_130 [8];
  ProxyContext context;
  BasicHandler local_108;
  Timestamp local_e8;
  TimerId local_d8;
  TimerId id;
  shared_ptr<Liby::TcpClient> tcpClient;
  string service;
  allocator local_89;
  undefined1 local_88 [8];
  string host;
  char address [50];
  char command;
  char ver;
  char *base;
  Buffer *readBuf;
  Connection *conn_local;
  TcpProxy *this_local;
  
  this_01 = (Buffer *)Liby::Connection::read(conn,(int)conn,in_RDX,in_RCX);
  oVar2 = Liby::Buffer::size(this_01);
  if (8 < oVar2) {
    pcVar3 = Liby::Buffer::data(this_01);
    if ((*pcVar3 == '\x04') && (pcVar3[1] == '\x01')) {
      pcVar5 = inet_ntop(2,pcVar3 + 4,host.field_2._M_local_buf + 8,0x32);
      if (pcVar5 == (char *)0x0) {
        Liby::Connection::destroy(conn);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_88,host.field_2._M_local_buf + 8,&local_89);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        uVar1 = ntohs(*(uint16_t *)(pcVar3 + 2));
        std::__cxx11::to_string
                  ((string *)
                   &tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(uint)uVar1);
        pLVar4 = Liby::Logger::getLogger();
        std::__cxx11::string::data();
        __x_00 = (double)std::__cxx11::string::data();
        Liby::Logger::log(pLVar4,__x_00);
        Liby::Buffer::retrieve(this_01);
        Liby::EventLoopGroup::creatTcpClient
                  ((EventLoopGroup *)&id,(string *)this->group_,(string *)local_88);
        peVar6 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&id);
        Liby::Timestamp::Timestamp(&local_e8,8,0);
        this_00 = &context.weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::shared_ptr<Liby::TcpClient>::shared_ptr
                  ((shared_ptr<Liby::TcpClient> *)this_00,(shared_ptr<Liby::TcpClient> *)&id);
        std::function<void()>::
        function<TcpProxy::handleConnectRequest(Liby::Connection&)::_lambda()_1_,void>
                  ((function<void()> *)&local_108,(anon_class_16_1_0de0f9ac *)this_00);
        TVar7 = Liby::TimerMixin::runAfter(&peVar6->super_TimerMixin,&local_e8,&local_108);
        std::function<void_()>::~function(&local_108);
        handleConnectRequest(Liby::Connection&)::{lambda()#1}::~Connection
                  ((_lambda___1_ *)
                   &context.weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        local_d8 = TVar7;
        std::enable_shared_from_this<Liby::Connection>::shared_from_this(&local_140);
        ProxyContext::ProxyContext
                  ((ProxyContext *)local_130,(shared_ptr<Liby::Connection> *)&local_140);
        std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)&local_140);
        peVar6 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&id);
        local_188.this = this;
        ProxyContext::ProxyContext(&local_188.context,(ProxyContext *)local_130);
        local_188.id = local_d8;
        std::function<void(std::shared_ptr<Liby::Connection>)>::
        function<TcpProxy::handleConnectRequest(Liby::Connection&)::_lambda(std::shared_ptr<Liby::Connection>)_1_,void>
                  ((function<void(std::shared_ptr<Liby::Connection>)> *)&local_160,&local_188);
        Liby::TcpClient::onConnect(peVar6,&local_160);
        std::function<void_(std::shared_ptr<Liby::Connection>)>::~function(&local_160);
        handleConnectRequest(Liby::Connection&)::{lambda(std::shared_ptr<Liby::Connection>)#1}::
        ~shared_ptr((_lambda_std__shared_ptr<Liby::Connection>__1_ *)&local_188);
        ProxyContext::~ProxyContext((ProxyContext *)local_130);
        std::shared_ptr<Liby::TcpClient>::~shared_ptr((shared_ptr<Liby::TcpClient> *)&id);
        std::__cxx11::string::~string
                  ((string *)
                   &tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)local_88);
      }
    }
    else {
      pLVar4 = Liby::Logger::getLogger();
      Liby::Logger::log(pLVar4,__x);
      Liby::Connection::destroy(conn);
    }
  }
  return;
}

Assistant:

void handleConnectRequest(Connection &conn) {
        Buffer &readBuf = conn.read();
        if (readBuf.size() < 9) {
            return;
        }

        char *base = readBuf.data();

        char ver = base[0];
        char command = base[1];

        if (ver != 4 || command != 1) {
            error("bad version %d or command %d", ver, command);
            conn.destroy();
            return;
        }

        char address[50];
        if (::inet_ntop(AF_INET, base + 4, address, 50) == nullptr) {
            conn.destroy();
            return;
        }

        string host = address;
        string service = to_string(ntohs(*(uint16_t *)(base + 2)));

        info("host: %s service: %s", host.data(), service.data());
        readBuf.retrieve();

        shared_ptr<TcpClient> tcpClient = group_.creatTcpClient(host, service);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        ProxyContext context = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                ProxyContext context1 = c;
                c->context_ = make_shared<ProxyContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<ProxyContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                char response[8];
                response[0] = 0x0;
                response[1] = 0x5A;
                c1->send(response, 8);

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }